

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
fmt::v7::detail::write_bytes<char,std::back_insert_iterator<std::__cxx11::string>>
          (detail *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          out,string_view bytes,basic_format_specs<char> *specs)

{
  long lVar1;
  char *pcVar2;
  int *piVar3;
  char *__n;
  ulong n;
  ulong uVar4;
  ptrdiff_t _Num;
  
  piVar3 = (int *)bytes.size_;
  __n = bytes.data_;
  pcVar2 = (char *)(long)*piVar3;
  if (-1 < (long)pcVar2) {
    lVar1 = *(long *)(this + 8);
    uVar4 = 0;
    if (__n <= pcVar2) {
      uVar4 = (long)pcVar2 - (long)__n;
    }
    n = uVar4 >> ((ulong)*(byte *)((long)&basic_data<void>::left_padding_shifts +
                                  (ulong)(*(byte *)((long)piVar3 + 9) & 0xf)) & 0x3f);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (size_type)(__n + *(byte *)((long)piVar3 + 0xe) * uVar4 + lVar1),'\0');
    pcVar2 = fill<char*,char>((char *)(lVar1 + *(long *)this),n,(fill_t<char> *)((long)piVar3 + 10))
    ;
    if (__n != (char *)0x0) {
      memmove(pcVar2,out.container,(size_t)__n);
    }
    fill<char*,char>(pcVar2 + (long)__n,uVar4 - n,(fill_t<char> *)((long)piVar3 + 10));
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

OutputIt write_bytes(OutputIt out, string_view bytes,
                     const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, bytes.size(), [bytes](iterator it) {
    const char* data = bytes.data();
    return copy_str<Char>(data, data + bytes.size(), it);
  });
}